

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::Brep> __thiscall
anurbs::Model::add<anurbs::Brep>(Model *this,Pointer<anurbs::Brep> *data,string *attributes)

{
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar1;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_a0;
  input_adapter local_80;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  Ref<anurbs::Brep> local_60 [2];
  shared_ptr<anurbs::Brep> local_40;
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *attributes_local;
  Pointer<anurbs::Brep> *data_local;
  Model *this_local;
  Ref<anurbs::Brep> *ref;
  
  local_29 = 0;
  local_28 = in_RCX;
  attributes_local = attributes;
  data_local = data;
  this_local = this;
  std::shared_ptr<anurbs::Brep>::shared_ptr(&local_40,(shared_ptr<anurbs::Brep> *)attributes);
  add<anurbs::Brep>(this,data);
  std::shared_ptr<anurbs::Brep>::~shared_ptr(&local_40);
  Ref<anurbs::Brep>::attributes(local_60);
  this_00 = std::__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_60);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_80,local_28);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&local_a0,(nullptr_t)0x0);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&local_70,&local_80,&local_a0,true);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,(Model *)data,&local_70);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_70);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function(&local_a0);
  nlohmann::detail::input_adapter::~input_adapter(&local_80);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)local_60);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref<anurbs::Brep>)
         RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<TData> add(Pointer<TData> data, const std::string& attributes)
    {
        const auto ref = add(data);

        ref.attributes()->load(*this, Json::parse(attributes));

        return ref;
    }